

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::IsInitializedImpl
               (MessageLite *msg)

{
  bool bVar1;
  
  if (((ulong)msg[1]._vptr_MessageLite & 1) == 0) {
LAB_003e380d:
    if (((ulong)msg[1]._vptr_MessageLite & 2) != 0) {
      bVar1 = FeatureSet::IsInitializedImpl((MessageLite *)msg[2]._vptr_MessageLite);
      if (!bVar1) goto LAB_003e3824;
    }
    bVar1 = true;
  }
  else {
    bVar1 = FeatureSet::IsInitializedImpl((MessageLite *)msg[1]._internal_metadata_.ptr_);
    if (bVar1) goto LAB_003e380d;
LAB_003e3824:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool FeatureSetDefaults_FeatureSetEditionDefault::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FeatureSetDefaults_FeatureSetEditionDefault&>(msg);
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._impl_.overridable_features_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.fixed_features_->IsInitialized()) return false;
  }
  return true;
}